

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status
pugi::impl::anon_unknown_0::load_stream_data_seek<char>
          (basic_istream<char,_std::char_traits<char>_> *stream,void **out_buffer,size_t *out_size)

{
  byte bVar1;
  ulong uVar2;
  streamoff sVar3;
  void *data_;
  undefined8 uVar4;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  size_t actual_length;
  auto_deleter<void> buffer;
  size_t max_suffix_size;
  size_t read_length;
  streamoff length;
  pos_type pos;
  auto_deleter<void> *in_stack_ffffffffffffff50;
  auto_deleter<void> local_78;
  undefined8 local_68;
  long local_60;
  undefined1 local_58 [16];
  fpos<__mbstate_t> local_48 [16];
  streamoff local_38;
  undefined1 local_30 [16];
  undefined8 *local_20;
  undefined8 *local_18;
  char *local_10;
  xml_parse_status local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = std::istream::tellg();
  std::istream::seekg((long)local_10,_S_beg);
  local_48 = (fpos<__mbstate_t>  [16])std::istream::tellg();
  local_38 = std::fpos<__mbstate_t>::operator-(local_48,(fpos<__mbstate_t> *)local_30);
  local_58 = local_30;
  std::istream::seekg(local_10,local_30._0_8_,local_30._8_8_);
  uVar2 = std::ios::fail();
  if ((uVar2 & 1) != 0) {
    return status_io_error;
  }
  sVar3 = std::fpos::operator_cast_to_long((fpos *)local_30);
  if (sVar3 < 0) {
    return status_io_error;
  }
  local_60 = local_38;
  if (local_38 < 0) {
    return status_out_of_memory;
  }
  local_68 = 1;
  data_ = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(local_38 + 1);
  auto_deleter<void>::auto_deleter
            (&local_78,data_,
             (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate);
  if (local_78.data == (void *)0x0) {
    local_4 = status_out_of_memory;
    goto LAB_00147db0;
  }
  std::istream::read(local_10,(long)local_78.data);
  bVar1 = std::ios::bad();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) == 0) {
      bVar1 = std::ios::fail();
      if ((bVar1 & 1) != 0) goto LAB_00147d18;
    }
    uVar4 = std::istream::gcount();
    in_stack_ffffffffffffff50 = (auto_deleter<void> *)auto_deleter<void>::release(&local_78);
    *local_18 = in_stack_ffffffffffffff50;
    *local_20 = uVar4;
    local_4 = status_ok;
  }
  else {
LAB_00147d18:
    local_4 = status_io_error;
  }
LAB_00147db0:
  auto_deleter<void>::~auto_deleter(in_stack_ffffffffffffff50);
  return local_4;
}

Assistant:

PUGI__FN xml_parse_status load_stream_data_seek(std::basic_istream<T>& stream, void** out_buffer, size_t* out_size)
	{
		// get length of remaining data in stream
		typename std::basic_istream<T>::pos_type pos = stream.tellg();
		stream.seekg(0, std::ios::end);
		std::streamoff length = stream.tellg() - pos;
		stream.seekg(pos);

		if (stream.fail() || pos < 0) return status_io_error;

		// guard against huge files
		size_t read_length = static_cast<size_t>(length);

		if (static_cast<std::streamsize>(read_length) != length || length < 0) return status_out_of_memory;

		size_t max_suffix_size = sizeof(char_t);

		// read stream data into memory (guard against stream exceptions with buffer holder)
		auto_deleter<void> buffer(xml_memory::allocate(read_length * sizeof(T) + max_suffix_size), xml_memory::deallocate);
		if (!buffer.data) return status_out_of_memory;

		stream.read(static_cast<T*>(buffer.data), static_cast<std::streamsize>(read_length));

		// read may set failbit | eofbit in case gcount() is less than read_length (i.e. line ending conversion), so check for other I/O errors
		if (stream.bad() || (!stream.eof() && stream.fail())) return status_io_error;

		// return buffer
		size_t actual_length = static_cast<size_t>(stream.gcount());
		assert(actual_length <= read_length);

		*out_buffer = buffer.release();
		*out_size = actual_length * sizeof(T);

		return status_ok;
	}